

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall tinygltf::BufferView::operator==(BufferView *this,BufferView *other)

{
  __type _Var1;
  bool bVar2;
  
  if (this->buffer != other->buffer) {
    return false;
  }
  if ((((this->byteLength == other->byteLength) && (this->byteOffset == other->byteOffset)) &&
      (this->byteStride == other->byteStride)) &&
     (((_Var1 = std::operator==(&this->name,&other->name), _Var1 && (this->target == other->target))
      && ((bVar2 = std::operator==(&(this->extensions)._M_t,&(other->extensions)._M_t), bVar2 &&
          (bVar2 = Equals(&this->extras,&other->extras), bVar2)))))) {
    return this->dracoDecoded == other->dracoDecoded;
  }
  return false;
}

Assistant:

bool BufferView::operator==(const BufferView &other) const {
  return this->buffer == other.buffer && this->byteLength == other.byteLength &&
         this->byteOffset == other.byteOffset &&
         this->byteStride == other.byteStride && this->name == other.name &&
         this->target == other.target && this->extensions == other.extensions &&
         this->extras == other.extras &&
         this->dracoDecoded == other.dracoDecoded;
}